

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

RequestBuilder * __thiscall restincurl::RequestBuilder::WithJson(RequestBuilder *this,string *body)

{
  RequestBuilder *pRVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  WithJson(this);
  std::__cxx11::string::string((string *)&bStack_38,(string *)body);
  pRVar1 = SendData<std::__cxx11::string>(this,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return pRVar1;
}

Assistant:

RequestBuilder& WithJson(std::string body) {
            WithJson();
            return SendData(std::move(body));
        }